

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_168::EarlyCastFinder::visitRefCast(EarlyCastFinder *this,RefCast *curr)

{
  bool bVar1;
  Module *module;
  Expression *this_00;
  LocalGet *pLVar2;
  reference pvVar3;
  value_type *bestMove;
  LocalGet *get;
  Expression *fallthrough;
  RefCast *curr_local;
  EarlyCastFinder *this_local;
  
  visitExpression(this,(Expression *)curr);
  module = Walker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
           ::getModule((Walker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
                        *)this);
  this_00 = Properties::getFallthrough((Expression *)curr,&this->options,module,AllowTeeBrIf);
  pLVar2 = Expression::dynCast<wasm::LocalGet>(this_00);
  if ((((pLVar2 != (LocalGet *)0x0) &&
       (pvVar3 = std::
                 vector<wasm::(anonymous_namespace)::RefCastInfo,_std::allocator<wasm::(anonymous_namespace)::RefCastInfo>_>
                 ::operator[](&this->currRefCastMove,(ulong)pLVar2->index),
       pvVar3->target != (LocalGet *)0x0)) &&
      (bVar1 = wasm::Type::operator!=
                         (&(pvVar3->target->super_SpecificExpression<(wasm::Expression::Id)8>).
                           super_Expression.type,
                          &(curr->super_SpecificExpression<(wasm::Expression::Id)63>).
                           super_Expression.type), bVar1)) &&
     (bVar1 = wasm::Type::isSubType
                        ((Type)(curr->super_SpecificExpression<(wasm::Expression::Id)63>).
                               super_Expression.type.id,
                         (Type)(pvVar3->target->super_SpecificExpression<(wasm::Expression::Id)8>).
                               super_Expression.type.id), bVar1)) {
    if (pvVar3->bestCast == (RefCast *)0x0) {
      pvVar3->bestCast = curr;
    }
    else {
      bVar1 = wasm::Type::operator!=
                        (&(pvVar3->bestCast->super_SpecificExpression<(wasm::Expression::Id)63>).
                          super_Expression.type,
                         &(curr->super_SpecificExpression<(wasm::Expression::Id)63>).
                          super_Expression.type);
      if ((bVar1) &&
         (bVar1 = wasm::Type::isSubType
                            ((Type)(curr->super_SpecificExpression<(wasm::Expression::Id)63>).
                                   super_Expression.type.id,
                             (Type)(pvVar3->bestCast->
                                   super_SpecificExpression<(wasm::Expression::Id)63>).
                                   super_Expression.type.id), bVar1)) {
        pvVar3->bestCast = curr;
      }
    }
  }
  return;
}

Assistant:

void visitRefCast(RefCast* curr) {
    visitExpression(curr);

    // Using fallthroughs here is fine due to the following cases.
    // Suppose we have types $A->$B->$C (where $C is the most refined)
    // and $D, which is an unrelated type.
    // Case 1:
    // (ref.cast $A (ref.cast $C (local.get $x)))
    //
    // ref.cast $C is initially chosen for $x. Then we consider ref.cast $A.
    // Since $A is less refined than $C, we ignore it.
    //
    // Case 2:
    // (ref.cast $C (ref.cast $A (local.get $x)))
    //
    // ref.cast $A is initially chosen for $x. Then we consider ref.cast $C,
    // which is more refined than ref.cast $A, so we replace it with ref.cast
    // $C.
    //
    // Case 3:
    // (ref.cast $B (ref.cast $B (local.get $x)))
    //
    // We initially choose to move the inner ref.cast $B. When we consider the
    // outer ref.cast $B, we can see that it has the same type as tge existing
    // ref.cast $B, so we ignore it.
    //
    // Case 4:
    // (ref.cast $D (ref.cast $C (local.get $x)))
    //
    // This would produce a trap and should already be optimized away
    // beforehand.
    //
    // If the best cast is already at the target location, we will still track
    // it in currRefCastMove to see if we can obtain a better cast. However, we
    // won't flush it.

    auto* fallthrough = Properties::getFallthrough(curr, options, *getModule());
    if (auto* get = fallthrough->dynCast<LocalGet>()) {
      auto& bestMove = currRefCastMove[get->index];
      // Do not move a cast if its type is not related to the target
      // local.get's type (i.e. not in a subtyping relationship). Otherwise
      // a type error will occur. Also, if the target local.get's type is
      // already more refined than this current cast, there is no point in
      // moving it.
      if (bestMove.target && bestMove.target->type != curr->type &&
          Type::isSubType(curr->type, bestMove.target->type)) {
        if (!bestMove.bestCast) {
          // If there isn't any other cast to move, the current cast is the
          // best.
          bestMove.bestCast = curr;
        } else if (bestMove.bestCast->type != curr->type &&
                   Type::isSubType(curr->type, bestMove.bestCast->type)) {
          // If the current cast is more refined than the best cast to move,
          // change the best cast to move.
          bestMove.bestCast = curr;
        }
        // We don't care about the safety of the cast at present. If there are
        // two casts with the same type one being safe and one being unsafe, the
        // first cast that we visit will be chosen to be moved. Perhaps in the
        // future we can consider prioritizing unsafe casts over safe ones since
        // users may be more interested in that.
      }
    }
  }